

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool __thiscall
ClipperLib::Clipper::JoinPoints(Clipper *this,Join *j,OutRec *outRec1,OutRec *outRec2)

{
  IntPoint *pIVar1;
  code UseFullInt64Range;
  long lVar2;
  long lVar3;
  OutPt *pOVar4;
  OutPt *pOVar5;
  cInt cVar6;
  bool InsertAfter;
  IntPoint IVar7;
  bool bVar8;
  bool bVar9;
  OutPt *pOVar10;
  OutPt *pOVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  OutPt *pOVar15;
  OutPt *pOVar16;
  OutPt *pOVar17;
  cInt *pcVar18;
  IntPoint pt3;
  IntPoint pt3_00;
  IntPoint pt3_01;
  IntPoint pt3_02;
  undefined1 in_stack_ffffffffffffff7c [12];
  cInt local_60;
  cInt Right;
  cInt Left;
  
  pOVar15 = j->OutPt1;
  pOVar16 = j->OutPt2;
  pIVar1 = &pOVar15->Pt;
  lVar13 = pIVar1->X;
  lVar2 = (pOVar15->Pt).Y;
  IVar7 = *pIVar1;
  lVar3 = (j->OffPt).Y;
  pOVar10 = pOVar15;
  if (lVar2 == lVar3) {
    lVar3 = (j->OffPt).X;
    if (((lVar3 != lVar13) || (lVar3 != (pOVar16->Pt).X)) || (lVar2 != (pOVar16->Pt).Y)) {
      do {
        pOVar11 = pOVar10;
        pOVar10 = pOVar11->Prev;
        if ((pOVar10 == pOVar15) || ((pOVar10->Pt).Y != lVar2)) break;
      } while (pOVar10 != pOVar16);
      pcVar18 = &(pOVar11->Pt).Y;
      do {
        pOVar10 = pOVar15;
        pOVar15 = pOVar10->Next;
        if ((pOVar15 == pOVar11) || ((pOVar15->Pt).Y != lVar2)) break;
      } while (pOVar15 != pOVar16);
      if (pOVar15 == pOVar11 || pOVar15 == pOVar16) {
        return false;
      }
      lVar13 = (pOVar16->Pt).Y;
      pOVar15 = pOVar16;
      do {
        pOVar17 = pOVar15;
        pOVar15 = pOVar17->Prev;
        if ((pOVar15 == pOVar10) || ((pOVar15->Pt).Y != lVar13)) break;
      } while (pOVar15 != pOVar16);
      do {
        pOVar15 = pOVar16;
        pOVar16 = pOVar15->Next;
        if ((pOVar16 == pOVar11) || (pOVar16 == pOVar17)) break;
      } while ((pOVar16->Pt).Y == lVar13);
      if (pOVar16 == pOVar17 || pOVar16 == pOVar11) {
        return false;
      }
      bVar8 = GetOverlap((pOVar11->Pt).X,(pOVar10->Pt).X,(pOVar17->Pt).X,(pOVar15->Pt).X,&Left,
                         &Right);
      if (!bVar8) {
        return false;
      }
      pOVar16 = (OutPt *)(pOVar11->Pt).X;
      if (Right < (long)pOVar16 || (long)pOVar16 < Left) {
        pOVar4 = (OutPt *)(pOVar17->Pt).X;
        if (Right < (long)pOVar4 || (long)pOVar4 < Left) {
          pOVar5 = (OutPt *)(pOVar10->Pt).X;
          if (Right < (long)pOVar5 || (long)pOVar5 < Left) {
            pOVar16 = (OutPt *)(pOVar15->Pt).X;
            bVar8 = (long)pOVar4 < (long)pOVar16;
            pcVar18 = &(pOVar15->Pt).Y;
          }
          else {
            bVar8 = (long)pOVar16 < (long)pOVar5;
            pOVar16 = pOVar5;
            pcVar18 = &(pOVar10->Pt).Y;
          }
        }
        else {
          bVar8 = (pOVar15->Pt).X < (long)pOVar4;
          pOVar16 = pOVar4;
          pcVar18 = &(pOVar17->Pt).Y;
        }
      }
      else {
        bVar8 = (pOVar10->Pt).X < (long)pOVar16;
      }
      cVar6 = *pcVar18;
      j->OutPt1 = pOVar11;
      j->OutPt2 = pOVar17;
      IVar7._4_12_ = in_stack_ffffffffffffff7c;
      IVar7.X._0_4_ = (uint)bVar8;
      bVar8 = JoinHorz((ClipperLib *)pOVar11,pOVar10,pOVar17,pOVar15,pOVar16,IVar7,SUB81(cVar6,0));
      return bVar8;
    }
    if (outRec1 != outRec2) {
      return false;
    }
    while (pOVar10 = pOVar10->Next, pOVar11 = pOVar16, pOVar10 != pOVar15) {
      lVar13 = (pOVar10->Pt).Y;
      if (((pOVar10->Pt).X != lVar3) || (lVar13 != lVar2)) goto LAB_0027dece;
    }
    lVar13 = (pOVar10->Pt).Y;
LAB_0027dece:
    do {
      pOVar11 = pOVar11->Next;
      if (pOVar11 == pOVar16) {
        lVar14 = (pOVar11->Pt).Y;
LAB_0027deec:
        bVar8 = lVar14 <= lVar2 == lVar2 < lVar13;
        if (bVar8) {
          bVar9 = lVar13 <= lVar2;
          InsertAfter = lVar2 < lVar13;
          pOVar10 = DupOutPt(pOVar15,bVar9);
          pOVar11 = DupOutPt(pOVar16,InsertAfter);
          (&pOVar15->Next)[InsertAfter] = pOVar16;
          (&pOVar16->Next)[bVar9] = pOVar15;
          (&pOVar10->Next)[bVar9] = pOVar11;
          (&pOVar11->Next)[InsertAfter] = pOVar10;
          j->OutPt1 = pOVar15;
          j->OutPt2 = pOVar10;
          return bVar8;
        }
        return bVar8;
      }
      lVar14 = (pOVar11->Pt).Y;
      if (((pOVar11->Pt).X != lVar3) || (lVar14 != lVar2)) goto LAB_0027deec;
    } while( true );
  }
  do {
    pOVar10 = pOVar10->Next;
    lVar14 = (pOVar10->Pt).Y;
    if ((pOVar10 == pOVar15) || ((pOVar10->Pt).X != lVar13)) break;
  } while (lVar14 == lVar2);
  pOVar11 = pOVar15;
  if (lVar14 <= lVar2) {
    local_60 = (j->OffPt).X;
    UseFullInt64Range =
         (this->_vptr_Clipper[-3] + 8)
         [(long)&(this->m_GhostJoins).
                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>];
    pt3.Y = lVar3;
    pt3.X = local_60;
    bVar8 = SlopesEqual(*pIVar1,pOVar10->Pt,pt3,(bool)UseFullInt64Range);
    if (bVar8) {
      bVar8 = false;
      goto LAB_0027dd9f;
    }
  }
  do {
    pOVar10 = pOVar11->Prev;
    lVar14 = (pOVar10->Pt).Y;
    if ((pOVar10 == pOVar15) || ((pOVar10->Pt).X != lVar13)) break;
    pOVar11 = pOVar10;
  } while (lVar14 == lVar2);
  if (lVar2 < lVar14) {
    return false;
  }
  local_60 = (j->OffPt).X;
  UseFullInt64Range =
       (this->_vptr_Clipper[-3] + 8)
       [(long)&(this->m_GhostJoins).
               super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>];
  pt3_00.Y = lVar3;
  pt3_00.X = local_60;
  bVar8 = SlopesEqual(IVar7,pOVar10->Pt,pt3_00,(bool)UseFullInt64Range);
  if (!bVar8) {
    return false;
  }
  bVar8 = true;
LAB_0027dd9f:
  pIVar1 = &pOVar16->Pt;
  lVar13 = pIVar1->X;
  lVar2 = (pOVar16->Pt).Y;
  IVar7 = *pIVar1;
  pOVar11 = pOVar16;
  do {
    pOVar11 = pOVar11->Next;
    lVar14 = (pOVar11->Pt).Y;
    if (((pOVar11->Pt).X != lVar13) || (lVar14 != lVar2)) break;
  } while (pOVar11 != pOVar16);
  pOVar17 = pOVar16;
  if ((lVar2 < lVar14) ||
     (pt3_01.Y = lVar3, pt3_01.X = local_60,
     bVar9 = SlopesEqual(*pIVar1,pOVar11->Pt,pt3_01,(bool)UseFullInt64Range), !bVar9)) {
    while( true ) {
      pOVar11 = pOVar17->Prev;
      lVar14 = (pOVar11->Pt).Y;
      if ((pOVar11->Pt).X != lVar13) break;
      if ((lVar14 != lVar2) || (pOVar17 = pOVar11, pOVar11 == pOVar16)) break;
    }
    if (lVar2 < lVar14) {
      return false;
    }
    pt3_02.Y = lVar3;
    pt3_02.X = local_60;
    bVar9 = SlopesEqual(IVar7,pOVar11->Pt,pt3_02,(bool)UseFullInt64Range);
    bVar12 = 1;
    if (!bVar9) {
      return false;
    }
  }
  else {
    bVar12 = 0;
  }
  if (pOVar10 == pOVar11) {
    return false;
  }
  if (pOVar10 == pOVar15) {
    return false;
  }
  if (pOVar11 == pOVar16) {
    return false;
  }
  if ((bool)(outRec1 == outRec2 & (bVar12 ^ bVar8 ^ 1))) {
    return false;
  }
  if (bVar8) {
    pOVar10 = DupOutPt(pOVar15,false);
    pOVar11 = DupOutPt(pOVar16,true);
    pOVar15->Prev = pOVar16;
    pOVar16->Next = pOVar15;
    pOVar10->Next = pOVar11;
    pOVar11->Prev = pOVar10;
  }
  else {
    pOVar10 = DupOutPt(pOVar15,true);
    pOVar11 = DupOutPt(pOVar16,false);
    pOVar15->Next = pOVar16;
    pOVar16->Prev = pOVar15;
    pOVar10->Prev = pOVar11;
    pOVar11->Next = pOVar10;
  }
  j->OutPt1 = pOVar15;
  j->OutPt2 = pOVar10;
  return true;
}

Assistant:

bool Clipper::JoinPoints(Join *j, OutRec* outRec1, OutRec* outRec2)
{
  OutPt *op1 = j->OutPt1, *op1b;
  OutPt *op2 = j->OutPt2, *op2b;

  //There are 3 kinds of joins for output polygons ...
  //1. Horizontal joins where Join.OutPt1 & Join.OutPt2 are vertices anywhere
  //along (horizontal) collinear edges (& Join.OffPt is on the same horizontal).
  //2. Non-horizontal joins where Join.OutPt1 & Join.OutPt2 are at the same
  //location at the Bottom of the overlapping segment (& Join.OffPt is above).
  //3. StrictSimple joins where edges touch but are not collinear and where
  //Join.OutPt1, Join.OutPt2 & Join.OffPt all share the same point.
  bool isHorizontal = (j->OutPt1->Pt.Y == j->OffPt.Y);

  if (isHorizontal  && (j->OffPt == j->OutPt1->Pt) &&
  (j->OffPt == j->OutPt2->Pt))
  {
    //Strictly Simple join ...
    if (outRec1 != outRec2) return false;
    op1b = j->OutPt1->Next;
    while (op1b != op1 && (op1b->Pt == j->OffPt)) 
      op1b = op1b->Next;
    bool reverse1 = (op1b->Pt.Y > j->OffPt.Y);
    op2b = j->OutPt2->Next;
    while (op2b != op2 && (op2b->Pt == j->OffPt)) 
      op2b = op2b->Next;
    bool reverse2 = (op2b->Pt.Y > j->OffPt.Y);
    if (reverse1 == reverse2) return false;
    if (reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  } 
  else if (isHorizontal)
  {
    //treat horizontal joins differently to non-horizontal joins since with
    //them we're not yet sure where the overlapping is. OutPt1.Pt & OutPt2.Pt
    //may be anywhere along the horizontal edge.
    op1b = op1;
    while (op1->Prev->Pt.Y == op1->Pt.Y && op1->Prev != op1b && op1->Prev != op2)
      op1 = op1->Prev;
    while (op1b->Next->Pt.Y == op1b->Pt.Y && op1b->Next != op1 && op1b->Next != op2)
      op1b = op1b->Next;
    if (op1b->Next == op1 || op1b->Next == op2) return false; //a flat 'polygon'

    op2b = op2;
    while (op2->Prev->Pt.Y == op2->Pt.Y && op2->Prev != op2b && op2->Prev != op1b)
      op2 = op2->Prev;
    while (op2b->Next->Pt.Y == op2b->Pt.Y && op2b->Next != op2 && op2b->Next != op1)
      op2b = op2b->Next;
    if (op2b->Next == op2 || op2b->Next == op1) return false; //a flat 'polygon'

    cInt Left, Right;
    //Op1 --> Op1b & Op2 --> Op2b are the extremites of the horizontal edges
    if (!GetOverlap(op1->Pt.X, op1b->Pt.X, op2->Pt.X, op2b->Pt.X, Left, Right))
      return false;

    //DiscardLeftSide: when overlapping edges are joined, a spike will created
    //which needs to be cleaned up. However, we don't want Op1 or Op2 caught up
    //on the discard Side as either may still be needed for other joins ...
    IntPoint Pt;
    bool DiscardLeftSide;
    if (op1->Pt.X >= Left && op1->Pt.X <= Right) 
    {
      Pt = op1->Pt; DiscardLeftSide = (op1->Pt.X > op1b->Pt.X);
    } 
    else if (op2->Pt.X >= Left&& op2->Pt.X <= Right) 
    {
      Pt = op2->Pt; DiscardLeftSide = (op2->Pt.X > op2b->Pt.X);
    } 
    else if (op1b->Pt.X >= Left && op1b->Pt.X <= Right)
    {
      Pt = op1b->Pt; DiscardLeftSide = op1b->Pt.X > op1->Pt.X;
    } 
    else
    {
      Pt = op2b->Pt; DiscardLeftSide = (op2b->Pt.X > op2->Pt.X);
    }
    j->OutPt1 = op1; j->OutPt2 = op2;
    return JoinHorz(op1, op1b, op2, op2b, Pt, DiscardLeftSide);
  } else
  {
    //nb: For non-horizontal joins ...
    //    1. Jr.OutPt1.Pt.Y == Jr.OutPt2.Pt.Y
    //    2. Jr.OutPt1.Pt > Jr.OffPt.Y

    //make sure the polygons are correctly oriented ...
    op1b = op1->Next;
    while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Next;
    bool Reverse1 = ((op1b->Pt.Y > op1->Pt.Y) ||
      !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse1)
    {
      op1b = op1->Prev;
      while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Prev;
      if ((op1b->Pt.Y > op1->Pt.Y) ||
        !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange)) return false;
    };
    op2b = op2->Next;
    while ((op2b->Pt == op2->Pt) && (op2b != op2))op2b = op2b->Next;
    bool Reverse2 = ((op2b->Pt.Y > op2->Pt.Y) ||
      !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse2)
    {
      op2b = op2->Prev;
      while ((op2b->Pt == op2->Pt) && (op2b != op2)) op2b = op2b->Prev;
      if ((op2b->Pt.Y > op2->Pt.Y) ||
        !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange)) return false;
    }

    if ((op1b == op1) || (op2b == op2) || (op1b == op2b) ||
      ((outRec1 == outRec2) && (Reverse1 == Reverse2))) return false;

    if (Reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  }
}